

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfsx11integration.cpp
# Opt level: O3

QSize __thiscall QEglFSX11Integration::screenSize(QEglFSX11Integration *this)

{
  void *pvVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long in_FS_OFFSET;
  XWindowAttributes a;
  QArrayData *local_d0;
  QSize local_c8;
  QArrayDataPointer<QByteArray> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_screenSize).wd.m_i < 1) || ((this->m_screenSize).ht.m_i < 1)) {
    local_48.size = -0x5555555555555556;
    local_48.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_48.ptr = (QByteArray *)0xaaaaaaaaaaaaaaaa;
    qgetenv((char *)&local_d0);
    QByteArray::split((char)&local_48);
    if (local_d0 != (QArrayData *)0x0) {
      LOCK();
      (local_d0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_d0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_d0,1,0x10);
      }
    }
    if (local_48.size == 2) {
      uVar2 = QByteArray::toInt((bool *)local_48.ptr,0);
      lVar4 = QByteArray::toInt((bool *)(local_48.ptr + 1),0);
      this->m_screenSize = (QSize)((ulong)uVar2 | lVar4 << 0x20);
    }
    else {
      memset(&local_d0,0xaa,0x88);
      pvVar1 = this->m_display;
      iVar3 = XGetWindowAttributes
                        (pvVar1,*(undefined8 *)
                                 (*(long *)((long)pvVar1 + 0xe8) + 0x10 +
                                 (long)*(int *)((long)pvVar1 + 0xe0) * 0x80),&local_d0);
      if (iVar3 != 0) {
        this->m_screenSize = local_c8;
      }
    }
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this->m_screenSize;
  }
  __stack_chk_fail();
}

Assistant:

QSize QEglFSX11Integration::screenSize() const
{
    if (m_screenSize.isEmpty()) {
        QList<QByteArray> env = qgetenv("EGLFS_X11_SIZE").split('x');
        if (env.size() == 2) {
            m_screenSize = QSize(env.at(0).toInt(), env.at(1).toInt());
        } else {
            XWindowAttributes a;
            if (XGetWindowAttributes(DISPLAY, DefaultRootWindow(DISPLAY), &a))
                m_screenSize = QSize(a.width, a.height);
        }
    }
    return m_screenSize;
}